

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::FieldDescriptorProto::InternalSerializeWithCachedSizesToArray
          (FieldDescriptorProto *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint32 uVar2;
  uint32 extraout_var;
  uint8 *target_00;
  FieldOptions *in_RDX;
  uint8 *in_RSI;
  FieldDescriptorProto *in_RDI;
  uint32 cached_has_bits;
  Operation in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  EpsCopyOutputStream *in_stack_fffffffffffffe00;
  EpsCopyOutputStream *in_stack_fffffffffffffe10;
  uint8 *in_stack_fffffffffffffe18;
  FieldOptions *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  uint32 num;
  FieldOptions *in_stack_fffffffffffffe30;
  EpsCopyOutputStream *in_stack_fffffffffffffe48;
  FieldOptions *in_stack_fffffffffffffe50;
  uint8 *local_190;
  
  num = (uint32)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  uVar1 = (in_RDI->_has_bits_).has_bits_[0];
  local_190 = in_RSI;
  if ((uVar1 & 1) != 0) {
    _internal_name_abi_cxx11_((FieldDescriptorProto *)0x4f9772);
    in_stack_fffffffffffffe48 = (EpsCopyOutputStream *)std::__cxx11::string::data();
    _internal_name_abi_cxx11_((FieldDescriptorProto *)0x4f9789);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8
               ,(char *)0x4f97a9);
    in_stack_fffffffffffffe50 = in_RDX;
    _internal_name_abi_cxx11_((FieldDescriptorProto *)0x4f97bd);
    local_190 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          ((EpsCopyOutputStream *)in_stack_fffffffffffffe30,num,
                           (string *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  }
  if ((uVar1 & 2) != 0) {
    _internal_extendee_abi_cxx11_((FieldDescriptorProto *)0x4f97ef);
    std::__cxx11::string::data();
    _internal_extendee_abi_cxx11_((FieldDescriptorProto *)0x4f9806);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8
               ,(char *)0x4f9826);
    _internal_extendee_abi_cxx11_((FieldDescriptorProto *)0x4f983a);
    local_190 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          ((EpsCopyOutputStream *)in_stack_fffffffffffffe30,num,
                           (string *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  }
  if ((uVar1 & 0x40) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              (in_stack_fffffffffffffe00,
               (uint8 **)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    _internal_number(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(3,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_190);
    local_190 = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          ((int32)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                           (uint8 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  if ((uVar1 & 0x100) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              (in_stack_fffffffffffffe00,
               (uint8 **)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    _internal_label(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(4,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_190);
    local_190 = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          ((int32)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                           (uint8 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  if ((uVar1 & 0x200) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              (in_stack_fffffffffffffe00,
               (uint8 **)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    _internal_type(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(5,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_190);
    local_190 = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          ((int32)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                           (uint8 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  if ((uVar1 & 4) != 0) {
    _internal_type_name_abi_cxx11_((FieldDescriptorProto *)0x4f9b46);
    std::__cxx11::string::data();
    num = extraout_var;
    _internal_type_name_abi_cxx11_((FieldDescriptorProto *)0x4f9b5d);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8
               ,(char *)0x4f9b7d);
    in_stack_fffffffffffffe30 = in_RDX;
    _internal_type_name_abi_cxx11_((FieldDescriptorProto *)0x4f9b91);
    local_190 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          ((EpsCopyOutputStream *)in_stack_fffffffffffffe30,num,
                           (string *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  }
  if ((uVar1 & 8) != 0) {
    _internal_default_value_abi_cxx11_((FieldDescriptorProto *)0x4f9bc3);
    in_stack_fffffffffffffe18 = (uint8 *)std::__cxx11::string::data();
    _internal_default_value_abi_cxx11_((FieldDescriptorProto *)0x4f9bda);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8
               ,(char *)0x4f9bfa);
    _internal_default_value_abi_cxx11_((FieldDescriptorProto *)0x4f9c0e);
    local_190 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          ((EpsCopyOutputStream *)in_stack_fffffffffffffe30,num,(string *)in_RDX,
                           in_stack_fffffffffffffe18);
    in_stack_fffffffffffffe20 = in_RDX;
  }
  if ((uVar1 & 0x20) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              (in_stack_fffffffffffffe00,
               (uint8 **)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    _Internal::options(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(8,WIRETYPE_LENGTH_DELIMITED);
    target_00 = io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_190);
    uVar2 = FieldOptions::GetCachedSize((FieldOptions *)0x4f9d01);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,target_00);
    local_190 = FieldOptions::InternalSerializeWithCachedSizesToArray
                          (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                           in_stack_fffffffffffffe10);
  }
  if ((uVar1 & 0x80) != 0) {
    io::EpsCopyOutputStream::EnsureSpace
              (in_stack_fffffffffffffe00,
               (uint8 **)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
    _internal_oneof_index(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(9,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_190);
    local_190 = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                          ((int32)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                           (uint8 *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  }
  if ((uVar1 & 0x10) != 0) {
    _internal_json_name_abi_cxx11_((FieldDescriptorProto *)0x4f9e44);
    std::__cxx11::string::data();
    _internal_json_name_abi_cxx11_((FieldDescriptorProto *)0x4f9e5b);
    std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              ((char *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8
               ,(char *)0x4f9e7b);
    _internal_json_name_abi_cxx11_((FieldDescriptorProto *)0x4f9e8f);
    local_190 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                          ((EpsCopyOutputStream *)in_stack_fffffffffffffe30,num,
                           (string *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    if (((uint)(in_RDI->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)&in_RDI->_internal_metadata_);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    local_190 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                          ((UnknownFieldSet *)in_RDI,(uint8 *)in_stack_fffffffffffffe50,
                           in_stack_fffffffffffffe48);
  }
  return local_190;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* FieldDescriptorProto::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FieldDescriptorProto)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_name().data(), static_cast<int>(this->_internal_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.name");
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_name(), target);
  }

  // optional string extendee = 2;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_extendee().data(), static_cast<int>(this->_internal_extendee().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.extendee");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_extendee(), target);
  }

  // optional int32 number = 3;
  if (cached_has_bits & 0x00000040u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(3, this->_internal_number(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Label label = 4;
  if (cached_has_bits & 0x00000100u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      4, this->_internal_label(), target);
  }

  // optional .google.protobuf.FieldDescriptorProto.Type type = 5;
  if (cached_has_bits & 0x00000200u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      5, this->_internal_type(), target);
  }

  // optional string type_name = 6;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_type_name().data(), static_cast<int>(this->_internal_type_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.type_name");
    target = stream->WriteStringMaybeAliased(
        6, this->_internal_type_name(), target);
  }

  // optional string default_value = 7;
  if (cached_has_bits & 0x00000008u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_default_value().data(), static_cast<int>(this->_internal_default_value().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.default_value");
    target = stream->WriteStringMaybeAliased(
        7, this->_internal_default_value(), target);
  }

  // optional .google.protobuf.FieldOptions options = 8;
  if (cached_has_bits & 0x00000020u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        8, _Internal::options(this), target, stream);
  }

  // optional int32 oneof_index = 9;
  if (cached_has_bits & 0x00000080u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(9, this->_internal_oneof_index(), target);
  }

  // optional string json_name = 10;
  if (cached_has_bits & 0x00000010u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_json_name().data(), static_cast<int>(this->_internal_json_name().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.FieldDescriptorProto.json_name");
    target = stream->WriteStringMaybeAliased(
        10, this->_internal_json_name(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FieldDescriptorProto)
  return target;
}